

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O0

mbedtls_ct_condition_t mbedtls_mpi_core_check_zero_ct(mbedtls_mpi_uint *A,size_t limbs)

{
  mbedtls_ct_condition_t mVar1;
  ulong in_RSI;
  long in_RDI;
  size_t i;
  mbedtls_mpi_uint bits;
  mbedtls_mpi_uint *force_read_A;
  undefined8 local_28;
  ulong x;
  
  x = 0;
  for (local_28 = 0; local_28 < in_RSI; local_28 = local_28 + 1) {
    x = *(ulong *)(in_RDI + local_28 * 8) | x;
  }
  mVar1 = mbedtls_ct_bool(x);
  return mVar1;
}

Assistant:

mbedtls_ct_condition_t mbedtls_mpi_core_check_zero_ct(const mbedtls_mpi_uint *A,
                                                      size_t limbs)
{
    volatile const mbedtls_mpi_uint *force_read_A = A;
    mbedtls_mpi_uint bits = 0;

    for (size_t i = 0; i < limbs; i++) {
        bits |= force_read_A[i];
    }

    return mbedtls_ct_bool(bits);
}